

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.h
# Opt level: O2

btMatrix3x3 * __thiscall btSoftBody::Body::invWorldInertia(Body *this)

{
  int iVar1;
  btMatrix3x3 *pbVar2;
  
  if (invWorldInertia()::iwi == '\0') {
    iVar1 = __cxa_guard_acquire(&invWorldInertia()::iwi);
    if (iVar1 != 0) {
      invWorldInertia::iwi.m_el[2].m_floats = (btScalar  [4])ZEXT816(0);
      invWorldInertia::iwi.m_el[1].m_floats = (btScalar  [4])ZEXT816(0);
      invWorldInertia::iwi.m_el[0].m_floats = (btScalar  [4])ZEXT816(0);
      __cxa_guard_release(&invWorldInertia()::iwi);
    }
  }
  pbVar2 = &invWorldInertia::iwi;
  if (this->m_soft != (Cluster *)0x0) {
    pbVar2 = &this->m_soft->m_invwi;
  }
  if (this->m_rigid != (btRigidBody *)0x0) {
    pbVar2 = (btMatrix3x3 *)&(this->m_rigid->super_btCollisionObject).field_0x14c;
  }
  return pbVar2;
}

Assistant:

const btMatrix3x3&			invWorldInertia() const
		{
			static const btMatrix3x3	iwi(0,0,0,0,0,0,0,0,0);
			if(m_rigid) return(m_rigid->getInvInertiaTensorWorld());
			if(m_soft)	return(m_soft->m_invwi);
			return(iwi);
		}